

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O0

double __thiscall
Trainer::Trainer<Kuhn::Game>::externalSamplingCFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex)

{
  long lVar1;
  Trainer<Kuhn::Game> *this_00;
  undefined4 uVar2;
  bool bVar3;
  uint actionNum_00;
  int iVar4;
  double *__wbegin;
  double dVar5;
  undefined1 *puStack_220;
  undefined1 auStack_218 [8];
  double local_210;
  double local_208;
  undefined1 *local_200;
  Trainer<Kuhn::Game> *local_1f8;
  result_type local_1ec;
  double *local_1e8;
  Node *local_1e0;
  mapped_type *local_1d8;
  Node *local_1d0;
  mapped_type *local_1c8;
  undefined1 local_1b9;
  int local_1b8;
  uint local_1b4;
  Trainer<Kuhn::Game> *local_1b0;
  double local_1a8;
  double regretSum;
  double regret;
  undefined1 local_190 [4];
  int a_1;
  Game game_cp_1;
  Trainer<Kuhn::Game> *pTStack_128;
  int a;
  double nodeUtil;
  unsigned_long __vla_expr0;
  double util;
  discrete_distribution<int> dist;
  Game game_cp;
  double *strategy;
  Node *node;
  int player;
  undefined1 local_48 [4];
  int actionNum;
  string infoSet;
  int playerIndex_local;
  Game *game_local;
  Trainer<Kuhn::Game> *this_local;
  
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  puStack_220 = (undefined1 *)0x12748c;
  local_1b0 = this;
  infoSet.field_2._12_4_ = playerIndex;
  bVar3 = Kuhn::Game::done(game);
  if (bVar3) {
    puStack_220 = (undefined1 *)0x12749e;
    this_local = (Trainer<Kuhn::Game> *)Kuhn::Game::payoff(game,infoSet.field_2._12_4_);
  }
  else {
    puStack_220 = (undefined1 *)0x1274b5;
    Kuhn::Game::infoSetStr_abi_cxx11_((string *)local_48,game);
    puStack_220 = (undefined1 *)0x1274be;
    actionNum_00 = Kuhn::Game::actionNum(game);
    puStack_220 = (undefined1 *)0x1274d8;
    local_1b4 = actionNum_00;
    iVar4 = Kuhn::Game::currentPlayer(game);
    local_1b9 = (local_1b0->mUpdate[iVar4] & 1U) != 0;
    local_1b8 = iVar4;
    if (!(bool)local_1b9) {
      puStack_220 = &LAB_00127540;
      __assert_fail("mUpdate[player] && \"External sampling with stochastically-weighted averaging cannot treat static player.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/bakanaouji[P]cpp-cfr/RegretMinimization/Trainer/Trainer.cpp"
                    ,0x1e2,
                    "double Trainer::Trainer<Kuhn::Game>::externalSamplingCFR(const T &, const int) [T = Kuhn::Game]"
                   );
    }
    puStack_220 = (undefined1 *)0x127568;
    local_1c8 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                ::operator[](&local_1b0->mNodeMap,(key_type *)local_48);
    strategy = (double *)*local_1c8;
    if ((mapped_type)strategy == (mapped_type)0x0) {
      puStack_220 = (undefined1 *)0x127594;
      local_1d0 = (Node *)operator_new(0x30);
      puStack_220 = (undefined1 *)0x1275ac;
      Node::Node(local_1d0,actionNum_00);
      strategy = (double *)local_1d0;
      local_1e0 = local_1d0;
      puStack_220 = (undefined1 *)0x1275db;
      local_1d8 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                  ::operator[](&local_1b0->mNodeMap,(key_type *)local_48);
      *local_1d8 = local_1e0;
    }
    puStack_220 = (undefined1 *)0x127622;
    Node::updateStrategy((Node *)strategy);
    puStack_220 = (undefined1 *)0x12762d;
    __wbegin = Node::strategy((Node *)strategy);
    local_1e8 = __wbegin;
    if (iVar4 == infoSet.field_2._12_4_) {
      lVar1 = -((ulong)actionNum_00 * 8 + 0xf & 0xfffffffffffffff0);
      local_200 = auStack_218 + lVar1;
      pTStack_128 = (Trainer<Kuhn::Game> *)0x0;
      for (game_cp_1._92_4_ = 0; (int)game_cp_1._92_4_ < (int)actionNum_00;
          game_cp_1._92_4_ = game_cp_1._92_4_ + 1) {
        *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x127798;
        Kuhn::Game::Game((Game *)local_190,game);
        uVar2 = game_cp_1._92_4_;
        *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1277ac;
        Kuhn::Game::step((Game *)local_190,uVar2);
        uVar2 = infoSet.field_2._12_4_;
        this_00 = local_1b0;
        *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1277c4;
        dVar5 = externalSamplingCFR(this_00,(Game *)local_190,uVar2);
        *(double *)(local_200 + (long)(int)game_cp_1._92_4_ * 8) = dVar5;
        pTStack_128 = (Trainer<Kuhn::Game> *)
                      (__wbegin[(int)game_cp_1._92_4_] *
                       *(double *)(local_200 + (long)(int)game_cp_1._92_4_ * 8) +
                      (double)pTStack_128);
        local_208 = dVar5;
      }
      for (regret._4_4_ = 0; iVar4 = regret._4_4_, regret._4_4_ < (int)actionNum_00;
          regret._4_4_ = regret._4_4_ + 1) {
        regretSum = *(double *)(local_200 + (long)regret._4_4_ * 8) - (double)pTStack_128;
        *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x127880;
        local_210 = Node::regretSum((Node *)strategy,iVar4);
        iVar4 = regret._4_4_;
        dVar5 = local_210 + regretSum;
        local_1a8 = dVar5;
        *(undefined8 *)(auStack_218 + lVar1 + -8) = 0x1278bd;
        Node::regretSum((Node *)strategy,iVar4,dVar5);
      }
      this_local = pTStack_128;
    }
    else {
      puStack_220 = (undefined1 *)0x12765d;
      Kuhn::Game::Game((Game *)&dist._M_param._M_cp.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,game);
      puStack_220 = (undefined1 *)0x127677;
      std::discrete_distribution<int>::discrete_distribution<double_const*>
                ((discrete_distribution<int> *)&util,__wbegin,__wbegin + (int)actionNum_00);
      puStack_220 = (undefined1 *)0x12768c;
      local_1ec = std::discrete_distribution<int>::operator()
                            ((discrete_distribution<int> *)&util,&local_1b0->mEngine);
      puStack_220 = (undefined1 *)0x1276a6;
      Kuhn::Game::step((Game *)&dist._M_param._M_cp.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_1ec);
      puStack_220 = (undefined1 *)0x1276be;
      this_local = (Trainer<Kuhn::Game> *)
                   externalSamplingCFR(local_1b0,
                                       (Game *)&dist._M_param._M_cp.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       infoSet.field_2._12_4_);
      puStack_220 = (undefined1 *)0x1276ed;
      local_1f8 = this_local;
      Node::strategySum((Node *)strategy,__wbegin,1.0);
      puStack_220 = (undefined1 *)0x127712;
      std::discrete_distribution<int>::~discrete_distribution((discrete_distribution<int> *)&util);
    }
    puStack_220 = (undefined1 *)0x1278ff;
    std::__cxx11::string::~string((string *)local_48);
  }
  return (double)this_local;
}

Assistant:

double Trainer<T>::externalSamplingCFR(const T &game, const int playerIndex) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // external sampling with stochastically-weighted averaging cannot treat static player
    const int actionNum = game.actionNum();
    const int player = game.currentPlayer();
    assert(mUpdate[player] && "External sampling with stochastically-weighted averaging cannot treat static player.");

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    node->updateStrategy();
    const double *strategy = node->strategy();

    // if current player is not the target player, sample a single action and recursively call cfr
    if (player != playerIndex) {
        auto game_cp(game);
        std::discrete_distribution<int> dist(strategy, strategy + actionNum);
        game_cp.step(dist(mEngine));
        const double util = externalSamplingCFR(game_cp, playerIndex);
        // update average strategy
        node->strategySum(strategy, 1.0);
        return util;
    }

    // for each action, recursively call cfr with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        utils[a] = externalSamplingCFR(game_cp, playerIndex);
        nodeUtil += strategy[a] * utils[a];
    }

    // for each action, compute and accumulate counterfactual regret
    for (int a = 0; a < actionNum; ++a) {
        const double regret = utils[a] - nodeUtil;
        const double regretSum = node->regretSum(a) + regret;
        node->regretSum(a, regretSum);
    }

    return nodeUtil;
}